

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintableTextTest.cpp
# Opt level: O0

void __thiscall PrintableTextTest::PrintableTextTest(PrintableTextTest *this)

{
  unique_ptr<oout::PrintableText<bool>,_std::default_delete<oout::PrintableText<bool>_>_> local_40;
  shared_ptr<oout::EqualTest> local_38;
  shared_ptr<const_oout::NamedTest> local_28;
  unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> local_18;
  PrintableTextTest *local_10;
  PrintableTextTest *this_local;
  
  local_10 = this;
  oout::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PrintableTextTest_003245f0;
  std::make_unique<oout::PrintableText<bool>,bool>((bool *)&local_40);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<oout::PrintableText<bool>,std::default_delete<oout::PrintableText<bool>>>,char_const(&)[5]>
            ((unique_ptr<oout::PrintableText<bool>,_std::default_delete<oout::PrintableText<bool>_>_>
              *)&local_38,(char (*) [5])&local_40);
  std::make_shared<oout::NamedTest_const,char_const(&)[26],std::shared_ptr<oout::EqualTest>>
            ((char (*) [26])&local_28,(shared_ptr<oout::EqualTest> *)"Boolean represent as text");
  std::make_unique<oout::NamedTest,char_const(&)[18],std::shared_ptr<oout::NamedTest_const>>
            ((char (*) [18])&local_18,(shared_ptr<const_oout::NamedTest> *)"PrintableTextTest");
  std::unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>>::
  unique_ptr<oout::NamedTest,std::default_delete<oout::NamedTest>,void>
            ((unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>> *)&this->tests,
             &local_18);
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr(&local_18);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(&local_28);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_38);
  std::unique_ptr<oout::PrintableText<bool>,_std::default_delete<oout::PrintableText<bool>_>_>::
  ~unique_ptr(&local_40);
  return;
}

Assistant:

PrintableTextTest::PrintableTextTest()
	: tests(
		make_unique<NamedTest>(
			"PrintableTextTest",
			make_shared<const NamedTest>(
				"Boolean represent as text",
				make_shared<EqualTest>(
					make_unique<PrintableText<bool>>(
						true
					),
					"true"
				)
			)
		)
	)
{
}